

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O2

int fft_segment_inv(mixed_segment *segment)

{
  uint n;
  float *pSrc;
  long lVar1;
  void *__dest;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  float fVar9;
  double dVar10;
  uint32_t out_samples;
  uint32_t in_samples;
  double local_c0;
  long local_b8;
  double local_b0;
  ulong local_a8;
  long local_a0;
  size_t local_98;
  void *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  undefined8 *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  float *out;
  float *in;
  
  puVar8 = (undefined8 *)segment->data;
  n = *(uint *)((long)puVar8 + 0x14);
  uVar5 = (ulong)n;
  local_c0 = (double)(ulong)*(uint *)(puVar8 + 3);
  local_a0 = puVar8[5];
  pSrc = (float *)puVar8[6];
  lVar1 = puVar8[7];
  __dest = (void *)puVar8[8];
  out_samples = 0xffffffff;
  uVar7 = uVar5 / (ulong)local_c0;
  local_b0 = (double)(ulong)(n >> 1);
  local_48 = (double)uVar5;
  local_b8 = uVar5 - uVar7;
  if (puVar8[4] == 0) {
    puVar8[4] = local_b8;
  }
  local_50 = (double)*(uint *)(puVar8 + 2) / local_48;
  local_58 = ((double)uVar7 * 6.283185307179586) / local_48;
  in_samples = n;
  mixed_buffer_request_write(&out,&out_samples,(mixed_buffer *)puVar8[1]);
  local_60 = (double)(long)local_c0;
  local_80 = (ulong)(n + 2);
  local_88 = (ulong)(n * 2);
  local_68 = (double)((long)local_c0 * (long)local_b0);
  local_90 = (void *)((long)__dest + uVar7 * 4);
  local_98 = uVar5 * 4;
  lVar4 = (long)local_b0 + 1;
  local_78 = uVar7;
  local_70 = puVar8;
  for (uVar6 = 0; uVar6 < out_samples; uVar6 = uVar6 + 1) {
    lVar3 = puVar8[4];
    out[uVar6] = *(float *)(local_a0 + (lVar3 - local_b8) * 4);
    lVar3 = lVar3 + 1;
    puVar8[4] = lVar3;
    if ((long)uVar5 <= lVar3) {
      puVar8[4] = local_b8;
      local_a8 = uVar6;
      iVar2 = mixed_buffer_request_read(&in,&in_samples,(mixed_buffer *)*puVar8);
      uVar6 = local_a8;
      if (iVar2 == 0) break;
      mixed_buffer_finish_read(in_samples,(mixed_buffer *)*puVar8);
      for (lVar3 = 0; uVar7 = local_80, lVar4 != lVar3; lVar3 = lVar3 + 1) {
        local_c0 = (double)in[lVar3 * 2 + 1];
        fVar9 = (float)((double)*(float *)(lVar1 + lVar3 * 4) +
                       (double)lVar3 * local_58 +
                       ((((double)in[lVar3 * 2] - (double)lVar3 * local_50) / local_50) *
                       6.283185307179586) / local_60);
        *(float *)(lVar1 + lVar3 * 4) = fVar9;
        local_b0 = (double)fVar9;
        dVar10 = cos(local_b0);
        pSrc[lVar3 * 2] = (float)(dVar10 * local_c0);
        dVar10 = sin(local_b0);
        pSrc[lVar3 * 2 + 1] = (float)(dVar10 * local_c0);
      }
      for (; uVar7 < local_88; uVar7 = uVar7 + 1) {
        pSrc[uVar7] = 0.0;
      }
      spiral_fft_float(n,1,pSrc,pSrc);
      for (uVar7 = 0; puVar8 = local_70, uVar5 != uVar7; uVar7 = uVar7 + 1) {
        dVar10 = cos(((double)(long)uVar7 * 6.283185307179586) / local_48);
        dVar10 = dVar10 * -0.5 + 0.5;
        *(float *)((long)__dest + uVar7 * 4) =
             (float)((double)*(float *)((long)__dest + uVar7 * 4) +
                    ((double)pSrc[uVar7 * 2] * (dVar10 + dVar10)) / local_68);
      }
      for (uVar7 = 0; uVar7 < local_78; uVar7 = uVar7 + 1) {
        *(undefined4 *)(local_a0 + uVar7 * 4) = *(undefined4 *)((long)__dest + uVar7 * 4);
      }
      memmove(__dest,local_90,local_98);
      uVar6 = local_a8;
    }
  }
  mixed_buffer_finish_write((uint32_t)uVar6,(mixed_buffer *)puVar8[1]);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_inv(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict out_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict phase_sum = data->phase;
  float *restrict output_accumulator = data->accumulator;

  float *restrict in, *restrict out;
  uint32_t in_samples = framesize;
  uint32_t out_samples = UINT32_MAX;

  double magnitude, phase, tmp, window;
  long i, k;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  mixed_buffer_request_write(&out, &out_samples, data->out);
  for(i=0; i<out_samples; i++){
    out[i] = out_fifo[data->overlap-fifo_latency];
    data->overlap++;

    if(data->overlap >= framesize){
      data->overlap = fifo_latency;
      
      if(!mixed_buffer_request_read(&in, &in_samples, data->in))
        break;
      mixed_buffer_finish_read(in_samples, data->in);
      for(k=0; k<=framesize2; k++){
        tmp = in[k*2];
        magnitude = in[k*2+1];

        tmp -= (double)k*bin_frequencies;
        tmp /= bin_frequencies;
        tmp = 2.*M_PI*tmp/oversampling;
        tmp += (double)k*expected;
        phase_sum[k] += tmp;
        phase = phase_sum[k];

        fft_workspace[2*k] = magnitude*cos(phase);
        fft_workspace[2*k+1] = magnitude*sin(phase);
      } 

      for(k=framesize+2; k<2*framesize; k++) fft_workspace[k] = 0.;

      spiral_fft_float(framesize, +1, fft_workspace, fft_workspace);

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        output_accumulator[k] += 2.*window*fft_workspace[2*k]/(framesize2*oversampling);
      }
      for(k=0; k<step; k++) out_fifo[k] = output_accumulator[k];

      memmove(output_accumulator, output_accumulator+step, framesize*sizeof(float));
    }
  }
  mixed_buffer_finish_write(i, data->out);

  return 1;
}